

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O0

void __thiscall IGameController::IGameController(IGameController *this,CGameContext *pGameServer)

{
  int iVar1;
  CConfig *pCVar2;
  IServer *pIVar3;
  CGameContext *in_RSI;
  IGameController *in_RDI;
  int local_34;
  vector2_base<float> *this_00;
  
  in_RDI->_vptr_IGameController = (_func_int **)&PTR_CanBeMovedOnBalance_00184d20;
  this_00 = in_RDI->m_aaSpawnPoints[0];
  do {
    vector2_base<float>::vector2_base(this_00);
    this_00 = this_00 + 1;
  } while (this_00 != (vector2_base<float> *)in_RDI->m_aNumSpawnPoints);
  in_RDI->m_pGameServer = in_RSI;
  pCVar2 = CGameContext::Config(in_RDI->m_pGameServer);
  in_RDI->m_pConfig = pCVar2;
  pIVar3 = CGameContext::Server(in_RDI->m_pGameServer);
  in_RDI->m_pServer = pIVar3;
  in_RDI->m_aTeamSize[0] = 0;
  in_RDI->m_aTeamSize[1] = 0;
  in_RDI->m_UnbalancedTick = -1;
  in_RDI->m_GameState = IGS_GAME_RUNNING;
  in_RDI->m_GameStateTimer = -1;
  pIVar3 = Server(in_RDI);
  iVar1 = IServer::Tick(pIVar3);
  in_RDI->m_GameStartTick = iVar1;
  in_RDI->m_MatchCount = 0;
  in_RDI->m_RoundCount = 0;
  in_RDI->m_SuddenDeath = 0;
  in_RDI->m_aTeamscore[0] = 0;
  in_RDI->m_aTeamscore[1] = 0;
  pCVar2 = Config(in_RDI);
  if (pCVar2->m_SvWarmup == 0) {
    SetGameState((IGameController *)in_RSI,(EGameState)((ulong)this_00 >> 0x20),(int)this_00);
  }
  else {
    Config(in_RDI);
    SetGameState((IGameController *)in_RSI,(EGameState)((ulong)this_00 >> 0x20),(int)this_00);
  }
  in_RDI->m_GameFlags = 0;
  in_RDI->m_pGameType = "unknown";
  (in_RDI->m_GameInfo).m_MatchCurrent = in_RDI->m_MatchCount + 1;
  Config(in_RDI);
  iVar1 = str_length((char *)0x128add);
  if (iVar1 != 0) {
    pCVar2 = Config(in_RDI);
    if (pCVar2->m_SvMatchesPerMap != 0) {
      pCVar2 = Config(in_RDI);
      local_34 = pCVar2->m_SvMatchesPerMap;
      goto LAB_00128b13;
    }
  }
  local_34 = 0;
LAB_00128b13:
  (in_RDI->m_GameInfo).m_MatchNum = local_34;
  pCVar2 = Config(in_RDI);
  (in_RDI->m_GameInfo).m_ScoreLimit = pCVar2->m_SvScorelimit;
  pCVar2 = Config(in_RDI);
  (in_RDI->m_GameInfo).m_TimeLimit = pCVar2->m_SvTimelimit;
  in_RDI->m_aMapWish[0] = '\0';
  in_RDI->m_aNumSpawnPoints[0] = 0;
  in_RDI->m_aNumSpawnPoints[1] = 0;
  in_RDI->m_aNumSpawnPoints[2] = 0;
  return;
}

Assistant:

IGameController::IGameController(CGameContext *pGameServer)
{
	m_pGameServer = pGameServer;
	m_pConfig = m_pGameServer->Config();
	m_pServer = m_pGameServer->Server();

	// balancing
	m_aTeamSize[TEAM_RED] = 0;
	m_aTeamSize[TEAM_BLUE] = 0;
	m_UnbalancedTick = TBALANCE_OK;

	// game
	m_GameState = IGS_GAME_RUNNING;
	m_GameStateTimer = TIMER_INFINITE;
	m_GameStartTick = Server()->Tick();
	m_MatchCount = 0;
	m_RoundCount = 0;
	m_SuddenDeath = 0;
	m_aTeamscore[TEAM_RED] = 0;
	m_aTeamscore[TEAM_BLUE] = 0;
	if(Config()->m_SvWarmup)
		SetGameState(IGS_WARMUP_USER, Config()->m_SvWarmup);
	else
		SetGameState(IGS_WARMUP_GAME, TIMER_INFINITE);

	// info
	m_GameFlags = 0;
	m_pGameType = "unknown";
	m_GameInfo.m_MatchCurrent = m_MatchCount+1;
	m_GameInfo.m_MatchNum = (str_length(Config()->m_SvMaprotation) && Config()->m_SvMatchesPerMap) ? Config()->m_SvMatchesPerMap : 0;
	m_GameInfo.m_ScoreLimit = Config()->m_SvScorelimit;
	m_GameInfo.m_TimeLimit = Config()->m_SvTimelimit;

	// map
	m_aMapWish[0] = 0;

	// spawn
	m_aNumSpawnPoints[0] = 0;
	m_aNumSpawnPoints[1] = 0;
	m_aNumSpawnPoints[2] = 0;
}